

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * __thiscall
kj::_::Debug::makeDescription<char_const(&)[66],capnp::Text::Reader>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,char (*params) [66],
          Reader *params_1)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  Reader *params_00;
  long lVar4;
  ArrayPtr<kj::String> argValues_00;
  String argValues [2];
  String local_48;
  String local_30;
  
  str<char_const(&)[66]>(&local_48,(kj *)macroArgs,(char (*) [66])macroArgs);
  str<capnp::Text::Reader&>(&local_30,(kj *)params,params_00);
  argValues_00.size_ = (size_t)params_1;
  argValues_00.ptr = (String *)0x2;
  makeDescriptionInternal(__return_storage_ptr__,this,(char *)&local_48,argValues_00);
  lVar4 = 0x18;
  do {
    lVar1 = *(long *)((long)&local_48.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_48.content.size_ + lVar4);
      *(undefined8 *)((long)&local_48.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_48.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_48.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}